

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
duckdb::make_uniq_base<duckdb::QueryNode,duckdb::RecursiveCTENode>(void)

{
  RecursiveCTENode *this;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> in_RDI;
  
  this = (RecursiveCTENode *)operator_new(0xe0);
  RecursiveCTENode::RecursiveCTENode(this);
  *(RecursiveCTENode **)
   in_RDI._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
   _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
   super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = this;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}